

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

void __thiscall
Js::Utf8SourceInfo::StopTrackingDeferredFunction(Utf8SourceInfo *this,LocalFunctionId functionID)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  undefined4 *puVar3;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar4;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_01;
  LocalFunctionId local_14;
  Utf8SourceInfo *pUStack_10;
  LocalFunctionId functionID_local;
  Utf8SourceInfo *this_local;
  
  local_14 = functionID;
  pUStack_10 = this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->m_scriptContext);
  bVar2 = ScriptContext::DoUndeferGlobalFunctions(this_00);
  if (bVar2) {
    if ((this->field_0xa8 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,399,"(m_deferredFunctionsInitialized)",
                                  "m_deferredFunctionsInitialized");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizedDictionary__
                        ((WriteBarrierPtr *)&this->m_deferredFunctionsDictionary);
    if (*ppSVar4 !=
        (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)0x0) {
      this_01 = Memory::
                WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
                ::operator->(&this->m_deferredFunctionsDictionary);
      JsUtil::
      SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
      ::Remove(this_01,&local_14);
    }
  }
  return;
}

Assistant:

void Utf8SourceInfo::StopTrackingDeferredFunction(Js::LocalFunctionId functionID)
    {
        if (this->m_scriptContext->DoUndeferGlobalFunctions())
        {
            Assert(m_deferredFunctionsInitialized);
            if (this->m_deferredFunctionsDictionary != nullptr)
            {
                this->m_deferredFunctionsDictionary->Remove(functionID);
            }
        }
    }